

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O0

void soplex::
     SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ::computeEquiExpVec(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *vecset,DataArray<int> *coScaleExp,DataArray<int> *scaleExp,
                        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *epsilon)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int *piVar6;
  cpp_dec_float<200U,_int,_void> *in_RCX;
  int __c;
  DataArray<int> *in_RDX;
  cpp_dec_float<200U,_int,_void> *in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxi;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffa28;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffa30;
  uint in_stack_fffffffffffffa38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffa48;
  undefined1 local_5b0 [96];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffac0;
  undefined8 local_530;
  undefined8 local_528;
  undefined1 local_51c [92];
  double in_stack_fffffffffffffb40;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffb48;
  undefined1 local_49c [128];
  undefined1 local_41c [128];
  undefined1 local_39c [256];
  undefined1 local_29c [128];
  undefined1 local_21c [128];
  uint local_19c;
  undefined8 local_198;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_190;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_110;
  int local_104;
  DataArray<int> *local_f8;
  cpp_dec_float<200U,_int,_void> *local_f0;
  undefined8 local_e0;
  undefined8 *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_90;
  undefined1 *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  undefined8 *local_60;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_51;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_104 = 0;
  local_f8 = in_RDX;
  local_f0 = in_RSI;
  while (iVar4 = local_104,
        iVar3 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::num((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x75267f), iVar4 < iVar3) {
    local_110 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffffa30,
                             (int)((ulong)in_stack_fffffffffffffa28 >> 0x20));
    local_198 = 0;
    local_d0 = &local_190;
    local_d8 = &local_198;
    local_e0 = 0;
    local_78 = local_d8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_RCX,(double)CONCAT44(iVar4,in_stack_fffffffffffffa38),in_stack_fffffffffffffa30);
    local_19c = 0;
    while (in_stack_fffffffffffffa38 = local_19c,
          iVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(local_110), (int)in_stack_fffffffffffffa38 < iVar4) {
      local_c8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_110,local_19c);
      local_c0 = local_39c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      in_stack_fffffffffffffa30 = local_f0;
      pcVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index(local_110,(char *)(ulong)local_19c,__c);
      DataArray<int>::operator[]((DataArray<int> *)in_stack_fffffffffffffa30,(int)pcVar5);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffffac0,in_stack_fffffffffffffabc);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)1>>
                (in_stack_fffffffffffffa48);
      local_10 = local_21c;
      local_18 = local_29c;
      local_8 = local_18;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      local_b0 = local_41c;
      local_b8 = local_21c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      local_a0 = local_49c;
      local_a8 = &local_190;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      local_90 = local_51c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      bVar1 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffac0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                         in_stack_fffffffffffffab0);
      if (bVar1) {
        local_80 = &local_190;
        local_88 = local_21c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      }
      local_19c = local_19c + 1;
    }
    local_528 = 0;
    tVar2 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffa28,(double *)0x75294b);
    if (tVar2) {
      local_530 = 0x3ff0000000000000;
      local_68 = &local_190;
      local_70 = &local_530;
      local_60 = local_70;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    }
    in_stack_fffffffffffffa48 =
         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
          *)0x3ff0000000000000;
    local_40 = local_5b0;
    local_48 = &stack0xfffffffffffffa48;
    local_50 = &local_190;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_51,local_50);
    local_38 = local_5b0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffa30);
    local_28 = local_5b0;
    local_20 = local_48;
    local_30 = local_50;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (in_stack_fffffffffffffa30,(double *)in_stack_fffffffffffffa28,
               (cpp_dec_float<200U,_int,_void> *)0x752a5c);
    in_stack_fffffffffffffa28 =
         (cpp_dec_float<200U,_int,_void> *)
         boost::multiprecision::number::operator_cast_to_double
                   ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)0x752a66);
    DataArray<int>::operator[](local_f8,local_104);
    spxFrexp((Real)in_stack_fffffffffffffa30,(int *)in_stack_fffffffffffffa28);
    piVar6 = DataArray<int>::operator[](local_f8,local_104);
    *piVar6 = *piVar6 + -1;
    local_104 = local_104 + 1;
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computeEquiExpVec(const SVSetBase<R>* vecset, const DataArray<int>& coScaleExp,
                                       DataArray<int>& scaleExp, R epsilon)
{
   assert(vecset != nullptr);

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(spxLdexp(vec.value(j), coScaleExp[vec.index(j)]));

         if(GT(x, maxi, epsilon))
            maxi = x;
      }

      // empty rows/cols are possible
      if(maxi == 0.0)
         maxi = 1.0;

      assert(maxi > 0.0);

      spxFrexp(Real(1.0 / maxi), &(scaleExp[i]));

      scaleExp[i] -= 1;
   }
}